

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon_maps.c
# Opt level: O2

dw_dungeon_tile get_dungeon_tile(dw_rom *rom,dw_map_index town,uint8_t x,uint8_t y)

{
  dw_map_meta *pdVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  
  pdVar1 = (rom->map).meta;
  uVar4 = (CONCAT71(in_register_00000011,x) & 0xffffffff) +
          ((ulong)pdVar1[town].width + 1) * (CONCAT71(in_register_00000009,y) & 0xffffffff);
  bVar2 = rom->content
          [(ulong)(*(ushort *)pdVar1[town].pointer & 0x7fff) + (uVar4 >> 1 & 0x7fffffff)] & 0xf;
  if ((uVar4 & 1) == 0) {
    bVar2 = rom->content
            [(ulong)(*(ushort *)pdVar1[town].pointer & 0x7fff) + (uVar4 >> 1 & 0x7fffffff)] >> 4;
  }
  bVar3 = bVar2 & 7;
  if (town < TANTEGEL_BASEMENT) {
    bVar3 = bVar2;
  }
  return (dw_dungeon_tile)bVar3;
}

Assistant:

dw_dungeon_tile get_dungeon_tile(dw_rom *rom, dw_map_index town, uint8_t x,
        uint8_t y)
{
    size_t offset = (size_t)y * (rom->map.meta[town].width+1) + x;
    size_t data_addr = ((*(uint16_t*)(&rom->map.meta[town].pointer)) & 0x7fff) +
        offset/2;
    uint8_t tile;

    if (offset % 2) {
        tile = rom->content[data_addr] & 0x0f;
    } else {
        tile = rom->content[data_addr] >> 4;
    }

    if (contains_roof_data(town)) {
        tile &= 0x7;
    }

    return (dw_dungeon_tile)tile;
}